

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall Character::SpellAct(Character *this)

{
  unsigned_short spell_id_00;
  ushort uVar1;
  SpellTarget SVar2;
  bool bVar3;
  ESF_Data *pEVar4;
  NPC *npc;
  Character *victim_00;
  reference ppVar5;
  element_type *peVar6;
  Quest *this_00;
  double dVar7;
  undefined1 local_60 [8];
  pair<const_short,_std::shared_ptr<Quest_Context>_> q;
  iterator __end1;
  iterator __begin1;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *__range1;
  unsigned_short spell_target_id;
  short spell_id;
  SpellTarget spell_target;
  NPC *npc_victim;
  Character *victim;
  ESF_Data *spell;
  Character *this_local;
  
  pEVar4 = ESF::Get(this->world->esf,(uint)this->spell_id);
  if ((pEVar4->id == 0) || (pEVar4->type == Bard)) {
    CancelSpell(this);
  }
  else {
    SVar2 = this->spell_target;
    spell_id_00 = this->spell_id;
    uVar1 = this->spell_target_id;
    CancelSpell(this);
    dVar7 = Timer::GetTime();
    this->spell_fired_time = dVar7;
    switch(SVar2) {
    case TargetSelf:
      if (pEVar4->target_restrict != Friendly) {
        return;
      }
      if (pEVar4->target != Self) {
        return;
      }
      Map::SpellSelf(this->map,this,spell_id_00);
      break;
    case TargetNPC:
      if (pEVar4->target_restrict == Friendly) {
        return;
      }
      if (pEVar4->target != Normal) {
        return;
      }
      npc = Map::GetNPCIndex(this->map,(uchar)uVar1);
      if (npc != (NPC *)0x0) {
        Map::SpellAttack(this->map,this,npc,spell_id_00);
      }
      break;
    case TargetPlayer:
      if (pEVar4->target_restrict == NPCOnly) {
        return;
      }
      if (pEVar4->target != Normal) {
        return;
      }
      victim_00 = Map::GetCharacterPID(this->map,(uint)uVar1);
      if ((pEVar4->target_restrict != Friendly) && (victim_00 == this)) {
        return;
      }
      if (victim_00 != (Character *)0x0) {
        Map::SpellAttackPK(this->map,this,victim_00,spell_id_00);
      }
      break;
    case TargetGroup:
      if (pEVar4->target_restrict != Friendly) {
        return;
      }
      if (pEVar4->target != Group) {
        return;
      }
      Map::SpellGroup(this->map,this,spell_id_00);
      break;
    default:
      goto switchD_0010c685_default;
    }
    __end1 = std::
             map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
             ::begin(&this->quests);
    q.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
         ::end(&this->quests);
    while (bVar3 = std::operator!=(&__end1,(_Self *)&q.second.
                                                  super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar3) {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>::
               operator*(&__end1);
      std::pair<const_short,_std::shared_ptr<Quest_Context>_>::pair
                ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_60,ppVar5);
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&q);
      if (bVar3) {
        peVar6 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&q);
        this_00 = Quest_Context::GetQuest(peVar6);
        bVar3 = Quest::Disabled(this_00);
        if (!bVar3) {
          peVar6 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&q);
          Quest_Context::UsedSpell(peVar6,spell_id_00);
        }
      }
      std::pair<const_short,_std::shared_ptr<Quest_Context>_>::~pair
                ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_60);
      std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>::operator++
                (&__end1);
    }
  }
switchD_0010c685_default:
  return;
}

Assistant:

void Character::SpellAct()
{
	const ESF_Data &spell = world->esf->Get(this->spell_id);

	if (spell.id == 0 || spell.type == ESF::Bard)
	{
		this->CancelSpell();
		return;
	}

	Character *victim;
	NPC *npc_victim;

	SpellTarget spell_target = this->spell_target;
	short spell_id = this->spell_id;
	unsigned short spell_target_id = this->spell_target_id;
	this->CancelSpell();

	this->spell_fired_time = Timer::GetTime();

	switch (spell_target)
	{
		case TargetSelf:
			if (spell.target_restrict != ESF::Friendly || spell.target != ESF::Self)
				return;

			this->map->SpellSelf(this, spell_id);

			break;

		case TargetNPC:
			if (spell.target_restrict == ESF::Friendly || spell.target != ESF::Normal)
				return;

			npc_victim = this->map->GetNPCIndex(spell_target_id);

			if (npc_victim)
				this->map->SpellAttack(this, npc_victim, spell_id);

			// *npc_victim may not be valid here

			break;

		case TargetPlayer:
			if (spell.target_restrict == ESF::NPCOnly || spell.target != ESF::Normal)
				return;

			victim = this->map->GetCharacterPID(spell_target_id);

			if (spell.target_restrict != ESF::Friendly && victim == this)
				return;

			if (victim)
				this->map->SpellAttackPK(this, victim, spell_id);

			break;

		case TargetGroup:
			if (spell.target_restrict != ESF::Friendly || spell.target != ESF::Group)
				return;

			this->map->SpellGroup(this, spell_id);

			break;

		default:
			return;
	}

	UTIL_FOREACH(this->quests, q)
	{
		if (!q.second || q.second->GetQuest()->Disabled())
			continue;

		q.second->UsedSpell(spell_id);
	}
}